

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonNumber.h
# Opt level: O0

string * __thiscall
Json::JsonNumber::toString_abi_cxx11_(string *__return_storage_ptr__,JsonNumber *this)

{
  ostringstream local_190 [8];
  ostringstream ost;
  JsonNumber *this_local;
  
  if ((this->__flag & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::operator<<(local_190,this->__Dn);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    std::__cxx11::to_string(__return_storage_ptr__,this->__In);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() override {
            if (__flag) return std::to_string(__In);
            std::ostringstream ost;
            ost << __Dn;
            return ost.str();
        }